

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# own_as_range.hpp
# Opt level: O2

iterator_range<burst::owning_iterator<std::forward_list<char,_std::allocator<char>_>_>_> *
__thiscall
burst::own_as_range_t::operator()
          (iterator_range<burst::owning_iterator<std::forward_list<char,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,own_as_range_t *this,
          forward_list<char,_std::allocator<char>_> *container)

{
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_> *in_RCX;
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_> end;
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_> begin;
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_> local_a8;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  _Fwd_list_node_base *local_78;
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_> local_68;
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_> local_48;
  
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_>::owning_iterator
            (&local_48,container);
  owning_iterator<std::forward_list<char,_std::allocator<char>_>_>::owning_iterator
            (&local_68,&local_48);
  local_88 = local_48.m_container.
             super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  _Stack_80._M_pi =
       local_48.m_container.
       super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_48.m_container.
  super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_48.m_container.
  super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = local_48.m_iterator._M_node;
  local_a8.m_container.
  super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_68.m_container.
           super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_a8.m_container.
  super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_68.m_container.
       super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_68.m_container.
  super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_68.m_container.
  super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.m_iterator._M_node = local_68.m_iterator._M_node;
  boost::make_iterator_range<burst::owning_iterator<std::forward_list<char,std::allocator<char>>>>
            (__return_storage_ptr__,(boost *)&local_88,&local_a8,in_RCX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.m_container.
              super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.m_container.
              super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.m_container.
              super___shared_ptr<std::forward_list<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container && container) const
        {
            auto begin = make_owning_iterator(std::forward<Container>(container));
            auto end = make_owning_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }